

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall cmm::ReturnStatementAST::dump(ReturnStatementAST *this,string *prefix)

{
  ExpressionAST *pEVar1;
  pointer pcVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"return\n",7);
  if ((this->ReturnValue)._M_t.
      super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl != (ExpressionAST *)0x0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"`---",4);
    pEVar1 = (this->ReturnValue)._M_t.
             super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
             super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    pcVar2 = (prefix->_M_dataplus)._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar2,pcVar2 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)local_38);
    (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return;
}

Assistant:

void ReturnStatementAST::dump(const std::string &prefix) const {
  std::cout << "return\n";
  if (!ReturnValue)
    return;
  std::cout << prefix << "`---";
  ReturnValue->dump(prefix + "    ");
}